

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O2

int64_t util::parse(char *s)

{
  char cVar1;
  char cVar2;
  long lVar3;
  invalid_argument *this;
  overflow_error *this_00;
  long lVar4;
  code *pcVar5;
  undefined *puVar6;
  char *pcVar7;
  allocator local_7a;
  allocator local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((s == (char *)0x0) || (cVar1 = *s, cVar1 == '\0')) {
    this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              ((invalid_argument *)this_00,"null or empty string argument");
    puVar6 = &std::invalid_argument::typeinfo;
    pcVar5 = std::invalid_argument::~invalid_argument;
  }
  else {
    pcVar7 = s + ((cVar1 - 0x2bU & 0xfd) == 0);
    lVar4 = 0;
    while( true ) {
      cVar2 = *pcVar7;
      if ((long)cVar2 == 0) break;
      if ((byte)(cVar2 - 0x3aU) < 0xf6) {
        this = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string((string *)&local_58,"invalid input string",&local_79);
        std::__cxx11::string::string((string *)&local_78,pcVar7,&local_7a);
        std::operator+(&local_38,&local_58,&local_78);
        std::invalid_argument::invalid_argument(this,(string *)&local_38);
        __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
      }
      lVar4 = (lVar4 * 10 - (long)cVar2) + 0x30;
      if (0 < lVar4) {
        this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
        std::overflow_error::overflow_error(this_00,"overflow occured when parsing");
        goto LAB_00104e8c;
      }
      pcVar7 = pcVar7 + 1;
    }
    lVar3 = -lVar4;
    if (cVar1 == '-') {
      lVar3 = lVar4;
    }
    if (lVar3 < 0 == (cVar1 == '-') || lVar4 == 0) {
      return lVar3;
    }
    this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
    std::overflow_error::overflow_error(this_00,"overflow occured when parsing");
LAB_00104e8c:
    puVar6 = &std::overflow_error::typeinfo;
    pcVar5 = std::overflow_error::~overflow_error;
  }
  __cxa_throw(this_00,puVar6,pcVar5);
}

Assistant:

std::int64_t parse(const char* s)
{
	if (s == nullptr || *s == '\0')
		throw std::invalid_argument("null or empty string argument");

	bool negative = (s[0] == '-');
	if (*s == '+' || *s == '-')
		++s;

	std::int64_t ret = 0;
	while (*s)
	{
		ret = ret * 10 - (*s - '0'); // assume negative since |min| >= |max|

		if (*s < '0' || *s > '9')
			throw std::invalid_argument(std::string("invalid input string") + std::string(s));

		if (ret > 0)
			throw std::overflow_error("overflow occured when parsing");

		++s;
	}
	ret = negative ? ret : -ret;
	if (negative != (ret < 0) && ret != 0)
		throw std::overflow_error("overflow occured when parsing");

	return ret;
}